

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_seq.c
# Opt level: O1

int mk_phone_seq(acmod_id_t **out_phone,uint32 *out_n_phone,char *trans,acmod_set_t *acmod_set,
                lexicon_t *lex)

{
  uint n_word;
  char **ptr;
  acmod_id_t *phone;
  char *pcVar1;
  uint32 n_phone;
  char *btw_mark;
  uint32 local_44;
  char *local_40;
  uint32 *local_38;
  
  local_38 = out_n_phone;
  n_word = str2words(trans,(char **)0x0,0);
  ptr = (char **)__ckd_calloc__((ulong)n_word,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_seq.c"
                                ,0x48);
  str2words(trans,ptr,n_word);
  phone = mk_phone_list(&local_40,&local_44,ptr,n_word,lex);
  if (phone == (acmod_id_t *)0x0) {
    pcVar1 = corpus_utt();
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_seq.c"
            ,0x4c,"Unable to produce phonetic transcription for the utterance \'%s\'.\n",pcVar1);
  }
  cvt2triphone(acmod_set,phone,local_40,local_44);
  ckd_free(local_40);
  ckd_free(ptr);
  *out_phone = phone;
  *local_38 = local_44;
  return 0;
}

Assistant:

int
mk_phone_seq(acmod_id_t **out_phone,
	     uint32 *out_n_phone,
	     char *trans,
	     acmod_set_t *acmod_set,
	     lexicon_t *lex)
{
    char **word;
    uint32 n_word;
    uint32 n_phone;
    acmod_id_t *phone;
    char *btw_mark;


    n_word = str2words(trans, NULL, 0);
    word = ckd_calloc(n_word, sizeof(char*));
    str2words(trans, word, n_word);
    phone = mk_phone_list(&btw_mark, &n_phone, word, n_word, lex);
    if (phone == NULL) {
	E_WARN("Unable to produce phonetic transcription for the utterance '%s'.\n", corpus_utt());
    }

    cvt2triphone(acmod_set, phone, btw_mark, n_phone);

    ckd_free(btw_mark);
    ckd_free(word);

    *out_phone = phone;
    *out_n_phone = n_phone;

    return S3_SUCCESS;
}